

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex_posix.c
# Opt level: O3

int condvar_wait_time(condvar_handle *condvar,mutex_handle *mutex,uint32_t msec)

{
  pthread_cond_t *__cond;
  void *pvVar1;
  int iVar2;
  int iVar3;
  timespec local_30;
  
  __cond = (pthread_cond_t *)condvar->priv;
  pvVar1 = mutex->priv;
  clock_gettime(0,&local_30);
  local_30.tv_nsec = (ulong)((msec % 1000) * 1000000) + local_30.tv_nsec;
  local_30.tv_sec = local_30.tv_sec + (ulong)msec / 1000 + local_30.tv_nsec / 1000000000;
  local_30.tv_nsec = local_30.tv_nsec % 1000000000;
  iVar2 = pthread_cond_timedwait(__cond,(pthread_mutex_t *)((long)pvVar1 + 0x30),&local_30);
  iVar3 = 1;
  if (iVar2 != 0x6e) {
    iVar3 = -iVar2;
  }
  return iVar3;
}

Assistant:

int condvar_wait_time(struct condvar_handle *condvar,
		      struct mutex_handle *mutex, uint32_t msec)
{
	struct condvar_priv *priv = condvar->priv;
	struct mutex_priv *mpriv = mutex->priv;
	struct timespec abstime;
	int ret;

	clock_gettime(CLOCK_REALTIME, &abstime);
	abstime.tv_nsec += (msec % 1000) * 1000000;
	abstime.tv_sec += (msec / 1000) + (abstime.tv_nsec / 1000000000);
	abstime.tv_nsec %= 1000000000;

	ret = pthread_cond_timedwait(&priv->cond, &mpriv->lock, &abstime);
	return ret == ETIMEDOUT ? 1 : -ret;
}